

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

void __thiscall Parser::reportError(Parser *this,ParserException *ex)

{
  bool bVar1;
  Parser *this_00;
  ostream *poVar2;
  long *in_RSI;
  char *in_stack_ffffffffffffff08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff10;
  Parser *in_stack_ffffffffffffff18;
  string local_a0 [32];
  string local_80 [32];
  string local_60 [48];
  string local_30 [32];
  long *local_10;
  
  local_10 = in_RSI;
  getFilename_abi_cxx11_(in_stack_ffffffffffffff18);
  bVar1 = std::operator==(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  std::__cxx11::string::~string(local_30);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Error: ");
    (**(code **)(*local_10 + 0x18))();
    poVar2 = std::operator<<(poVar2,local_60);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_60);
  }
  else {
    this_00 = (Parser *)std::operator<<((ostream *)&std::cout,"Error in ");
    getFilename_abi_cxx11_(this_00);
    poVar2 = std::operator<<((ostream *)this_00,local_80);
    poVar2 = std::operator<<(poVar2,": ");
    (**(code **)(*local_10 + 0x18))(local_a0);
    poVar2 = std::operator<<(poVar2,local_a0);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_a0);
    std::__cxx11::string::~string(local_80);
  }
  return;
}

Assistant:

void Parser::reportError(const ParserException& ex)
{
	if ( getFilename()=="" )
		std::cout << "Error: " << ex.toString() << std::endl;
	else
		std::cout << "Error in " << getFilename() << ": " << ex.toString() << std::endl;
}